

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::AggregateMarking::SetAggregateMarkingString
          (AggregateMarking *this,KINT8 *M,KUINT16 StringSize)

{
  KException *this_00;
  KString local_40;
  
  if (StringSize < 0x20) {
    strncpy(this->m_sAggregateMarkingString,M,(ulong)StringSize);
    this->m_sAggregateMarkingString[StringSize] = '\0';
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"SetAggregateMarkingString","");
  KException::KException(this_00,&local_40,3);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void AggregateMarking::SetAggregateMarkingString( const KINT8 * M, KUINT16 StringSize )
{
    if( StringSize > 31 ) throw KException( __FUNCTION__, STRING_PDU_SIZE_TOO_BIG );

    strncpy( m_sAggregateMarkingString, M, StringSize );

    m_sAggregateMarkingString[StringSize] = '\0';
}